

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_scene.cpp
# Opt level: O2

void __thiscall FGLRenderer::RenderView(FGLRenderer *this,player_t *player)

{
  TObjPtr<AActor> *obj;
  float ratio;
  float fovratio;
  bool bVar1;
  DFrameBuffer *pDVar2;
  uint uVar3;
  AActor *pAVar4;
  AActor *pAVar5;
  DThinker *pDVar6;
  DWORD *this_00;
  double dVar7;
  TThinkerIterator<ADynamicLight> it;
  
  pDVar2 = screen;
  checkBenchActive();
  obj = &player->camera;
  pAVar5 = (AActor *)pDVar2[0x22].super_DSimpleCanvas.super_DCanvas.super_DObject._vptr_DObject;
  this_00 = (DWORD *)obj;
  pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
  if (pAVar4 != pAVar5) {
    R_ResetViewInterpolation();
    this_00 = (DWORD *)obj;
    pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
    pDVar2[0x22].super_DSimpleCanvas.super_DCanvas.super_DObject._vptr_DObject =
         (_func_int **)pAVar5;
  }
  gl_RenderState.mVertexBuffer = &this->mVBO->super_FVertexBuffer;
  GLRenderer->mVBO->mCurIndex = GLRenderer->mVBO->mIndex;
  ResetProfilingData();
  dVar7 = 1.0;
  if ((cl_capfps.Value == false) && (r_NoInterpolate == false)) {
    this_00 = &r_FrameTime;
    dVar7 = I_GetTimeFrac(&r_FrameTime);
  }
  r_TicFracF = dVar7;
  uVar3 = I_MSTime();
  gl_frameMS = (long)uVar3;
  P_FindParticleSubsectors();
  if (gl.legacyMode == false) {
    this_00 = (DWORD *)GLRenderer->mLights;
    FLightBuffer::Clear((FLightBuffer *)this_00);
  }
  bVar1 = NoInterpolateView;
  NoInterpolateView = false;
  FCanvasTextureInfo::UpdateAll();
  ratio = RenderView::ratios[WidescreenRatio];
  fovratio = *(float *)(&DAT_0067b170 + (ulong)((long)WidescreenRatio == 4) * 4);
  NoInterpolateView = bVar1;
  SetFixedColormap((FGLRenderer *)this_00,player);
  TThinkerIterator<ADynamicLight>::TThinkerIterator
            ((TThinkerIterator<ADynamicLight> *)&it.super_FThinkerIterator,0x40);
  pDVar6 = FThinkerIterator::Next(&it.super_FThinkerIterator);
  GLRenderer->mLightCount = (uint)(pDVar6 != (DThinker *)0x0);
  pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
  RenderViewpoint(this,pAVar5,(GL_IRECT *)0x0,(float)FieldOfView.Degrees,ratio,fovratio,true,true);
  return;
}

Assistant:

void FGLRenderer::RenderView (player_t* player)
{
	OpenGLFrameBuffer* GLTarget = static_cast<OpenGLFrameBuffer*>(screen);
	AActor *&LastCamera = GLTarget->LastCamera;

	checkBenchActive();
	if (player->camera != LastCamera)
	{
		// If the camera changed don't interpolate
		// Otherwise there will be some not so nice effects.
		R_ResetViewInterpolation();
		LastCamera=player->camera;
	}

	gl_RenderState.SetVertexBuffer(mVBO);
	GLRenderer->mVBO->Reset();

	// reset statistics counters
	ResetProfilingData();

	// Get this before everything else
	if (cl_capfps || r_NoInterpolate) r_TicFracF = 1.;
	else r_TicFracF = I_GetTimeFrac (&r_FrameTime);
	gl_frameMS = I_MSTime();

	P_FindParticleSubsectors ();

	if (!gl.legacyMode) GLRenderer->mLights->Clear();

	// NoInterpolateView should have no bearing on camera textures, but needs to be preserved for the main view below.
	bool saved_niv = NoInterpolateView;
	NoInterpolateView = false;
	// prepare all camera textures that have been used in the last frame
	FCanvasTextureInfo::UpdateAll();
	NoInterpolateView = saved_niv;


	// I stopped using BaseRatioSizes here because the information there wasn't well presented.
	//							4:3				16:9		16:10		17:10		5:4
	static float ratios[]={1.333333f, 1.777777f, 1.6f, 1.7f, 1.25f, 1.7f, 2.333333f};

	// now render the main view
	float fovratio;
	float ratio = ratios[WidescreenRatio];
	if (! Is54Aspect(WidescreenRatio))
	{
		fovratio = 1.333333f;
	}
	else
	{
		fovratio = ratio;
	}

	SetFixedColormap (player);

	// Check if there's some lights. If not some code can be skipped.
	TThinkerIterator<ADynamicLight> it(STAT_DLIGHT);
	GLRenderer->mLightCount = ((it.Next()) != NULL);

	sector_t * viewsector = RenderViewpoint(player->camera, NULL, FieldOfView.Degrees, ratio, fovratio, true, true);

	All.Unclock();
}